

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O2

void __thiscall layer::Convolution2D::propagate(Convolution2D *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  longdouble *plVar10;
  tensor ppplVar11;
  tensor *pppplVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar15;
  long lVar16;
  uint uVar17;
  scalar *psVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  int posZOut;
  long lVar22;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar23;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar24;
  longdouble in_ST5;
  longdouble lVar25;
  undefined6 in_stack_ffffffffffffff92;
  
  for (lVar22 = 0; lVar22 < (this->super_Layer)._sizeZOut; lVar22 = lVar22 + 1) {
    for (lVar15 = 0; lVar15 < (this->super_Layer)._sizeYOut; lVar15 = lVar15 + 1) {
      for (lVar16 = 0; lVar16 < (this->super_Layer)._sizeXOut; lVar16 = lVar16 + 1) {
        plVar10 = (this->super_Layer)._out[lVar22][lVar15];
        lVar23 = (longdouble)0;
        plVar10[lVar16] = lVar23;
        uVar1 = (this->super_Layer)._sizeYWeight;
        uVar2 = (this->super_Layer)._sizeZWeight;
        iVar3 = this->_stepY;
        iVar4 = this->_zeroPaddingY;
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        lVar24 = in_ST5;
        lVar25 = in_ST5;
        for (psVar18 = (scalar *)0x0; psVar18 != (scalar *)(ulong)uVar2;
            psVar18 = (scalar *)((long)psVar18 + 1)) {
          iVar5 = this->_stepX;
          iVar6 = this->_zeroPaddingX;
          uVar7 = (this->super_Layer)._sizeXWeight;
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
          iVar8 = this->_sizeYIn;
          uVar17 = iVar3 * (int)lVar15 - iVar4;
          for (uVar20 = 0; uVar20 != uVar1; uVar20 = uVar20 + 1) {
            if ((-1 < (int)uVar17) && ((int)uVar17 < iVar8)) {
              iVar9 = this->_sizeXIn;
              ppplVar11 = (this->super_Layer)._in;
              pppplVar12 = (this->super_Layer)._ptrWeight;
              uVar19 = iVar5 * (int)lVar16 - iVar6;
              for (lVar21 = 0; (ulong)uVar7 * 0x10 != lVar21; lVar21 = lVar21 + 0x10) {
                if ((-1 < (int)uVar19) && ((int)uVar19 < iVar9)) {
                  lVar23 = ppplVar11[(long)psVar18][uVar17][uVar19] *
                           *(longdouble *)((long)pppplVar12[lVar22][(long)psVar18][uVar20] + lVar21)
                           + lVar23;
                  plVar10[lVar16] = lVar23;
                  lVar24 = in_ST4;
                  lVar25 = in_ST4;
                }
                uVar19 = uVar19 + 1;
              }
            }
            uVar17 = uVar17 + 1;
          }
        }
        auVar13._10_6_ = in_stack_ffffffffffffff92;
        auVar13._0_10_ = lVar23;
        in_ST5 = lVar25;
        (*(this->super_Layer)._fDerivative)(psVar18,(scalar)auVar13);
        (this->super_Layer)._derivative[lVar22][lVar15][lVar16] = in_ST0;
        auVar14._10_6_ = in_stack_ffffffffffffff92;
        auVar14._0_10_ = (this->super_Layer)._out[lVar22][lVar15][lVar16];
        in_ST0 = in_ST2;
        in_ST2 = in_ST4;
        in_ST4 = lVar25;
        (*(this->super_Layer)._fActivation)(psVar18,(scalar)auVar14);
        (this->super_Layer)._out[lVar22][lVar15][lVar16] = in_ST1;
        in_ST1 = in_ST3;
        in_ST3 = lVar24;
      }
    }
  }
  return;
}

Assistant:

void Convolution2D::propagate()
    {
        int posXIn = 0;
        int posYIn = 0;


        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {
                    _out[posZOut][posYOut][posXOut] = 0;

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeXIn)) {
                                                  _out[posZOut][posYOut][posXOut] +=
                                                _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel] *
                                                _in[posZKernel][posYIn][posXIn];
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                    _derivative[posZOut][posYOut][posXOut] = _fDerivative(_out[posZOut][posYOut][posXOut]);
                    _out[posZOut][posYOut][posXOut] = _fActivation(_out[posZOut][posYOut][posXOut]);

                }
            }
        }
    }